

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::LoopControlException::LoopControlException
          (LoopControlException *this,LoopControlType control_type)

{
  char *__lhs;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [36];
  int local_c;
  
  __lhs = "break";
  if (in_ESI == 1) {
    __lhs = "continue";
  }
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,in_RDI);
  std::runtime_error::runtime_error((runtime_error *)in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator(&local_51);
  *(undefined ***)in_RDI = &PTR__LoopControlException_00530700;
  *(int *)&in_RDI->field_2 = local_c;
  return;
}

Assistant:

LoopControlException(LoopControlType control_type)
      : std::runtime_error((control_type == LoopControlType::Continue ? "continue" : "break") + std::string(" outside of a loop")),
        control_type(control_type) {}